

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::InputLess<tcu::Matrix<float,_3,_2>_>::operator()
          (InputLess<tcu::Matrix<float,_3,_2>_> *this,Matrix<float,_3,_2> *mat1,
          Matrix<float,_3,_2> *mat2)

{
  Vector<float,_3> *vec2;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  InputLess<tcu::Vector<float,_3>_> local_3a;
  InputLess<tcu::Vector<float,_3>_> local_39;
  Vector<float,_3> *local_38;
  
  bVar2 = InputLess<tcu::Vector<float,_3>_>::operator()
                    (&local_3a,(Vector<float,_3> *)mat1,(Vector<float,_3> *)mat2);
  bVar3 = true;
  if (!bVar2) {
    local_38 = (mat1->m_data).m_data + 1;
    vec2 = (mat2->m_data).m_data + 1;
    bVar6 = 1;
    bVar1 = 1;
    do {
      bVar5 = bVar1;
      bVar2 = InputLess<tcu::Vector<float,_3>_>::operator()
                        (&local_39,(Vector<float,_3> *)mat2,(Vector<float,_3> *)mat1);
      mat1 = (Matrix<float,_3,_2> *)local_38;
      bVar4 = bVar5 ^ 1;
      if (bVar4 != 0 || bVar2) {
        if (bVar2) {
          bVar5 = bVar6;
        }
        break;
      }
      bVar3 = InputLess<tcu::Vector<float,_3>_>::operator()(&local_3a,local_38,vec2);
      mat2 = (Matrix<float,_3,_2> *)vec2;
      bVar6 = bVar5;
      bVar1 = 0;
    } while (!bVar3);
    bVar3 = (bool)(((bVar4 | bVar2) ^ 1) & bVar5);
  }
  return bVar3;
}

Assistant:

bool operator() (const Matrix<T, Rows, Cols>& mat1,
					 const Matrix<T, Rows, Cols>& mat2) const
	{
		for (int col = 0; col < Cols; ++col)
		{
			if (inputLess(mat1[col], mat2[col]))
				return true;
			if (inputLess(mat2[col], mat1[col]))
				return false;
		}

		return false;
	}